

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

void do_actual_learning_ldf<true>(cbify *data,multi_learner *base,multi_ex *ec_seq)

{
  vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_> *this;
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  *this_00;
  label_t *plVar1;
  undefined8 *puVar2;
  wclass **ppwVar3;
  uint uVar4;
  example *peVar5;
  pointer pvVar6;
  pointer pvVar7;
  size_t sVar8;
  action_score *paVar9;
  pointer pvVar10;
  label_t lVar11;
  label_t lVar12;
  float *pfVar13;
  float *pfVar14;
  wclass *pwVar15;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *pvVar16;
  cbify *pcVar17;
  multi_learner *pmVar18;
  int iVar19;
  pointer ppeVar20;
  vw_exception *pvVar21;
  uint32_t uVar22;
  pointer pvVar23;
  ulong uVar24;
  multi_ex *__range1;
  ulong uVar25;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *__range1_1;
  long lVar26;
  float fVar27;
  uint32_t chosen_action;
  cb_class cl;
  stringstream __msg;
  uint local_224;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *local_220;
  cb_class local_218;
  cbify *local_208;
  multi_learner *local_200;
  string local_1f8;
  string local_1d8;
  pointer_____offset_0x10___ *local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  local_220 = &data->cs_costs;
  this = &data->cb_costs;
  this_00 = &data->cb_as;
  local_208 = data;
  local_200 = base;
  std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>::
  resize(local_220,
         (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3);
  std::vector<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::resize
            (this,(long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3);
  std::
  vector<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ::resize(this_00,(long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                         .super__Vector_impl_data._M_start >> 3);
  ppeVar20 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar20) {
    lVar26 = 0;
    uVar25 = 0;
    do {
      peVar5 = ppeVar20[uVar25];
      pvVar23 = (local_220->
                super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (peVar5->l).multi;
      lVar12 = (label_t)(peVar5->l).cs.costs._end;
      sVar8 = (peVar5->l).cs.costs.erase_count;
      puVar2 = (undefined8 *)((long)&pvVar23->end_array + lVar26);
      *puVar2 = (peVar5->l).cs.costs.end_array;
      puVar2[1] = sVar8;
      plVar1 = (label_t *)((long)&pvVar23->_begin + lVar26);
      *plVar1 = lVar11;
      plVar1[1] = lVar12;
      v_array<CB::cb_class>::clear
                ((v_array<CB::cb_class> *)
                 ((long)&((this->
                          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar26));
      v_array<ACTION_SCORE::action_score>::clear
                ((v_array<ACTION_SCORE::action_score> *)
                 ((long)&((this_00->
                          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_begin + lVar26));
      pvVar6 = (this->
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      plVar1 = (label_t *)((long)&pvVar6->_begin + lVar26);
      lVar11 = *plVar1;
      lVar12 = plVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar6->end_array + lVar26);
      sVar8 = puVar2[1];
      (peVar5->l).cs.costs.end_array = (wclass *)*puVar2;
      (peVar5->l).cs.costs.erase_count = sVar8;
      (peVar5->l).multi = lVar11;
      (peVar5->l).cs.costs._end = (wclass *)lVar12;
      pvVar7 = (this_00->
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (undefined8 *)((long)&pvVar7->_begin + lVar26);
      pfVar13 = (float *)*puVar2;
      pfVar14 = (float *)puVar2[1];
      puVar2 = (undefined8 *)((long)&pvVar7->end_array + lVar26);
      sVar8 = puVar2[1];
      (peVar5->pred).scalars.end_array = (float *)*puVar2;
      (peVar5->pred).scalars.erase_count = sVar8;
      (peVar5->pred).scalars._begin = pfVar13;
      (peVar5->pred).scalars._end = pfVar14;
      uVar25 = uVar25 + 1;
      ppeVar20 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      lVar26 = lVar26 + 0x20;
    } while (uVar25 < (ulong)((long)(ec_seq->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar20 >> 3)
            );
  }
  pmVar18 = local_200;
  pvVar16 = local_220;
  (**(code **)(local_200 + 0x30))
            (*(undefined8 *)(local_200 + 0x18),*(undefined8 *)(local_200 + 0x20),ec_seq);
  pcVar17 = local_208;
  peVar5 = *(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  sVar8 = local_208->example_counter;
  local_208->example_counter = sVar8 + 1;
  local_1b0 = (peVar5->pred).scalars._begin;
  local_218._8_8_ = *(undefined8 *)((long)&peVar5->pred + 8);
  local_1b8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_218._0_8_ =
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar19 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                     (sVar8 + local_208->app_seed,&local_1b8,&local_218,&local_224);
  if (iVar19 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Failed to sample from pdf",0x19);
    pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar21,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x111,&local_1d8);
    __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar9 = (peVar5->pred).a_s._begin;
  uVar4 = paVar9[local_224].action;
  uVar22 = uVar4 + 1;
  local_218.action = uVar22;
  local_218.probability = paVar9[local_224].score;
  if (uVar22 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"No action with non-zero probability found!",0x2a);
    pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar21,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x118,&local_1f8);
    __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  pvVar23 = (pcVar17->cs_costs).
            super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  fVar27 = 0.0;
  do {
    if (pvVar23 ==
        (pcVar17->cs_costs).
        super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001db977:
      local_218.cost = (pcVar17->loss1 - pcVar17->loss0) * fVar27 + pcVar17->loss0;
      v_array<CB::cb_class>::push_back
                ((v_array<CB::cb_class> *)
                 &((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4]->l).simple,&local_218);
      (**(code **)(pmVar18 + 0x28))
                (*(undefined8 *)(pmVar18 + 0x18),*(undefined8 *)(pmVar18 + 0x20),ec_seq);
      ppeVar20 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppeVar20 !=
          (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar25 = (ulong)(local_218.action - 1);
        uVar24 = 0;
        do {
          if (uVar25 == uVar24) {
            (ppeVar20[uVar25]->pred).multiclass = local_218.action;
            pvVar10 = (pvVar16->
                      super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            peVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar25];
            pvVar23 = pvVar10 + uVar25;
            lVar11 = (label_t)pvVar23->_begin;
            pwVar15 = pvVar23->_end;
            ppwVar3 = &pvVar10[uVar25].end_array;
            sVar8 = (size_t)ppwVar3[1];
            (peVar5->l).cs.costs.end_array = *ppwVar3;
            (peVar5->l).cs.costs.erase_count = sVar8;
            (peVar5->l).multi = lVar11;
            (peVar5->l).cs.costs._end = pwVar15;
          }
          else {
            (ppeVar20[uVar24]->pred).scalar = 0.0;
          }
          uVar24 = uVar24 + 1;
          ppeVar20 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
        } while (uVar24 < (ulong)((long)(ec_seq->
                                        super__Vector_base<example_*,_std::allocator<example_*>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar20
                                 >> 3));
      }
      return;
    }
    if (pvVar23->_begin->class_index == uVar22) {
      fVar27 = pvVar23->_begin->x;
      goto LAB_001db977;
    }
    pvVar23 = pvVar23 + 1;
  } while( true );
}

Assistant:

void do_actual_learning_ldf(cbify& data, multi_learner& base, multi_ex& ec_seq)
{
  auto& cs_costs = data.cs_costs;
  auto& cb_costs = data.cb_costs;
  auto& cb_as = data.cb_as;

  // change label and pred data for cb
  cs_costs.resize(ec_seq.size());
  cb_costs.resize(ec_seq.size());
  cb_as.resize(ec_seq.size());
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    auto& ec = *ec_seq[i];
    cs_costs[i] = ec.l.cs.costs;
    cb_costs[i].clear();
    cb_as[i].clear();
    ec.l.cb.costs = cb_costs[i];
    ec.pred.a_s = cb_as[i];
  }

  base.predict(ec_seq);

  auto& out_ec = *ec_seq[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if(!cl.action)
    THROW("No action with non-zero probability found!");

  cl.cost = loss_csldf(data, cs_costs, cl.action);

  // add cb label to chosen action
  auto& lab = ec_seq[cl.action - 1]->l.cb;
  lab.costs.push_back(cl);

  base.learn(ec_seq);

  // set cs prediction and reset cs costs
  for (size_t i = 0; i < ec_seq.size(); ++i)
  {
    if (i == cl.action - 1)
    {
      ec_seq[i]->pred.multiclass = cl.action;
      ec_seq[i]->l.cs.costs = cs_costs[cl.action - 1]; // only need this cost for eval
    }
    else
      ec_seq[i]->pred.multiclass = 0;
  }
}